

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  PFNGLUSEPROGRAMPROC p_Var1;
  char cVar2;
  int iVar3;
  GLuint GVar4;
  GLFWwindow *handle;
  Shader *pSVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  char *__to;
  char *__to_00;
  path *ppVar10;
  float fVar11;
  double dVar12;
  path shader_dir_path;
  Shader shader_bezier;
  Shader shader_overlay;
  path local_208;
  path local_1e0;
  path local_1b8;
  Shader local_190;
  Shader local_170;
  path local_150;
  path local_128;
  path local_100;
  byte local_d8;
  path local_d0;
  path local_a8;
  path local_80;
  path local_58;
  
  if (argc < 2) {
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
              (&local_1b8,(char (*) [15])"../src/shader/",auto_format);
    std::filesystem::__cxx11::operator/(&local_1e0,&local_208,&local_1b8);
    std::filesystem::__cxx11::path::~path(&local_1b8);
    std::filesystem::__cxx11::path::~path(&local_208);
  }
  else {
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              (&local_1e0,argv + 1,auto_format);
  }
  cVar2 = std::filesystem::status(&local_1e0);
  if ((cVar2 == '\0') || (cVar2 == -1)) {
    std::filesystem::__cxx11::path::~path(&local_1e0);
    local_d8 = 0;
  }
  else {
    std::filesystem::__cxx11::path::path(&local_100,&local_1e0);
    local_d8 = 1;
    std::filesystem::__cxx11::path::~path(&local_1e0);
    if ((local_d8 & 1) != 0) {
      std::filesystem::__cxx11::path::path(&local_1e0,&local_100);
      glfwInit();
      glfwWindowHint(0x22002,4);
      glfwWindowHint(0x22003,1);
      glfwWindowHint(0x22008,0x32001);
      handle = glfwCreateWindow((anonymous_namespace)::ws,DAT_0014a2ec,
                                "Bezier Curve with OpenGL Tessellation",(GLFWmonitor *)0x0,
                                (GLFWwindow *)0x0);
      if (handle == (GLFWwindow *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"glfw window create failed",0x19);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        exit(-2);
      }
      glfwMakeContextCurrent(handle);
      iVar3 = gladLoadGLLoader(glfwGetProcAddress);
      if (iVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"GLAD init failed",0x10);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        exit(-3);
      }
      glfwSetMouseButtonCallback(handle,anon_unknown.dwarf_57a8::input::mouse_button_callback);
      glfwSetCursorPosCallback(handle,anon_unknown.dwarf_57a8::input::cursor_pos_callback);
      glfwSetKeyCallback(handle,anon_unknown.dwarf_57a8::input::key_callback);
      glfwSetFramebufferSizeCallback
                (handle,anon_unknown.dwarf_57a8::input::framebuffer_size_callback);
      Shader::Shader(&local_190);
      Shader::Shader(&local_170);
      std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
                (&local_1b8,(char (*) [12])"bezier.vert",auto_format);
      std::filesystem::__cxx11::operator/(&local_208,&local_1e0,&local_1b8);
      pSVar5 = Shader::attach(&local_190,&local_208,0x8b31);
      std::filesystem::__cxx11::path::path<char[16],std::filesystem::__cxx11::path>
                (&local_150,(char (*) [16])"bezier.tcs.glsl",auto_format);
      std::filesystem::__cxx11::operator/(&local_128,&local_1e0,&local_150);
      pSVar5 = Shader::attach(pSVar5,&local_128,0x8e88);
      std::filesystem::__cxx11::path::path<char[16],std::filesystem::__cxx11::path>
                (&local_80,(char (*) [16])"bezier.tes.glsl",auto_format);
      std::filesystem::__cxx11::operator/(&local_58,&local_1e0,&local_80);
      pSVar5 = Shader::attach(pSVar5,&local_58,0x8e87);
      std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
                (&local_d0,(char (*) [12])"bezier.frag",auto_format);
      std::filesystem::__cxx11::operator/(&local_a8,&local_1e0,&local_d0);
      ppVar10 = &local_a8;
      pSVar5 = Shader::attach(pSVar5,ppVar10,0x8b30);
      Shader::link(pSVar5,(char *)ppVar10,__to);
      std::filesystem::__cxx11::path::~path(&local_a8);
      std::filesystem::__cxx11::path::~path(&local_d0);
      std::filesystem::__cxx11::path::~path(&local_58);
      std::filesystem::__cxx11::path::~path(&local_80);
      std::filesystem::__cxx11::path::~path(&local_128);
      std::filesystem::__cxx11::path::~path(&local_150);
      std::filesystem::__cxx11::path::~path(&local_208);
      std::filesystem::__cxx11::path::~path(&local_1b8);
      std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
                (&local_1b8,(char (*) [13])"overlay.vert",auto_format);
      std::filesystem::__cxx11::operator/(&local_208,&local_1e0,&local_1b8);
      pSVar5 = Shader::attach(&local_170,&local_208,0x8b31);
      std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
                (&local_150,(char (*) [13])"overlay.frag",auto_format);
      std::filesystem::__cxx11::operator/(&local_128,&local_1e0,&local_150);
      ppVar10 = &local_128;
      pSVar5 = Shader::attach(pSVar5,ppVar10,0x8b30);
      Shader::link(pSVar5,(char *)ppVar10,__to_00);
      std::filesystem::__cxx11::path::~path(&local_128);
      std::filesystem::__cxx11::path::~path(&local_150);
      std::filesystem::__cxx11::path::~path(&local_208);
      std::filesystem::__cxx11::path::~path(&local_1b8);
      (*glad_glPatchParameteri)(0x8e72,4);
      p_Var1 = glad_glUseProgram;
      GVar4 = Shader::id(&local_190);
      (*p_Var1)(GVar4);
      (*glad_glGenVertexArrays)(1,&DAT_0014a348);
      (*glad_glBindVertexArray)(DAT_0014a348);
      (*glad_glGenBuffers)(1,&DAT_0014a350);
      (*glad_glBindBuffer)(0x8892,DAT_0014a350);
      (*glad_glBufferData)(0x8892,0x20,&DAT_0014a2f8,0x88e8);
      (*glad_glEnableVertexAttribArray)(0);
      (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
      p_Var1 = glad_glUseProgram;
      GVar4 = Shader::id(&local_170);
      (*p_Var1)(GVar4);
      (*glad_glGenVertexArrays)(1,&DAT_0014a34c);
      (*glad_glBindVertexArray)(DAT_0014a34c);
      (*glad_glBindBuffer)(0x8892,DAT_0014a350);
      (*glad_glEnableVertexAttribArray)(0);
      (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
      (*glad_glGenBuffers)(1,&DAT_0014a354);
      (*glad_glBindBuffer)(0x8892,DAT_0014a354);
      (*glad_glBufferData)(0x8892,0x30,&DAT_0014a318,0x88e4);
      (*glad_glEnableVertexAttribArray)(1);
      (*glad_glVertexAttribPointer)(1,3,0x1406,'\0',0,(void *)0x0);
      (*glad_glLineWidth)(1.0);
      (*glad_glPointSize)(10.0);
      (*glad_glClearColor)(0.227451,0.227451,0.227451,1.0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Before render-loop: GLerror = ",0x1e);
      (*glad_glGetError)();
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      lVar7 = std::chrono::_V2::system_clock::now();
      std::chrono::_V2::system_clock::now();
      do {
        (*glad_glClear)(0x4000);
        p_Var1 = glad_glUseProgram;
        GVar4 = Shader::id(&local_190);
        (*p_Var1)(GVar4);
        (*glad_glBindVertexArray)(DAT_0014a348);
        (*glad_glDrawArrays)(0xe,0,4);
        p_Var1 = glad_glUseProgram;
        GVar4 = Shader::id(&local_170);
        (*p_Var1)(GVar4);
        (*glad_glBindVertexArray)(DAT_0014a34c);
        (*glad_glDrawArrays)(0,0,4);
        glfwSwapBuffers(handle);
        glfwPollEvents();
        lVar8 = std::chrono::_V2::system_clock::now();
        dVar12 = (double)(lVar8 - lVar7) * -1e-09 + 16666667.0;
        if (dVar12 <= 0.0) {
          dVar12 = 0.0;
        }
        fVar11 = (float)dVar12;
        if (0.0 < fVar11) {
          local_208._M_pathname._M_dataplus._M_p = (pointer)(long)(fVar11 / 1e+09);
          local_208._M_pathname._M_string_length =
               (size_type)(fVar11 - (float)(long)local_208._M_pathname._M_dataplus._M_p * 1e+09);
          do {
            iVar3 = nanosleep((timespec *)&local_208,(timespec *)&local_208);
            if (iVar3 != -1) break;
            piVar9 = __errno_location();
          } while (*piVar9 == 4);
        }
        iVar3 = glfwWindowShouldClose(handle);
        lVar7 = lVar8;
        if (iVar3 != 0) {
          (*glad_glDeleteVertexArrays)(1,&DAT_0014a348);
          (*glad_glDeleteVertexArrays)(1,&DAT_0014a34c);
          (*glad_glDeleteBuffers)(1,&DAT_0014a350);
          (*glad_glDeleteBuffers)(1,&DAT_0014a354);
          Shader::destroy(&local_190);
          glfwDestroyWindow(handle);
          glfwTerminate();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"After cleanup: GLerror = ",0x19);
          (*glad_glGetError)();
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if (local_170.createdShaders.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_170.createdShaders.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_170.createdShaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.createdShaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_190.createdShaders.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_190.createdShaders.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_190.createdShaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_190.createdShaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::filesystem::__cxx11::path::~path(&local_1e0);
          if (local_d8 == 1) {
            local_d8 = 0;
            std::filesystem::__cxx11::path::~path(&local_100);
          }
          return 0;
        }
      } while( true );
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please specify shader directory, for example:\n\t",0x2f);
  std::operator<<((ostream *)&std::cout,"$ ./bezier \"../src/shader/\"\n");
  exit(-1);
}

Assistant:

int main(int argc, char *argv[]) {
  using namespace std::string_literals;

  auto maybe_shader_dir = resrc::path::find_shader_folder(argc, argv);
  if (!maybe_shader_dir.has_value()) {
    std::cout << "Please specify shader directory, for example:\n\t"
              << "$ ./bezier \"../src/shader/\"\n";
    exit(-1);
  }
  const auto shader_dir_path = maybe_shader_dir.value();

  // std::setlocale(LC_ALL, "POSIX");

  // Init glfw
  glfwInit();
  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 1);
  glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

  // Get window from glfw + init GLAD
  auto window = glfwCreateWindow(ws.win_sz[0], ws.win_sz[1],
                                 "Bezier Curve with OpenGL Tessellation",
                                 nullptr, nullptr);
  if (window == nullptr) {
    std::cerr << "glfw window create failed" << std::endl;
    exit(-2);
  }
  glfwMakeContextCurrent(window);
  if (!gladLoadGLLoader(GLADloadproc(glfwGetProcAddress))) {
    std::cerr << "GLAD init failed" << std::endl;
    exit(-3);
  }

  // Handle inputs
  glfwSetMouseButtonCallback(window, input::mouse_button_callback);
  glfwSetCursorPosCallback(window, input::cursor_pos_callback);
  glfwSetKeyCallback(window, input::key_callback);
  glfwSetFramebufferSizeCallback(window, input::framebuffer_size_callback);

  Shader shader_bezier, shader_overlay;
  shader_bezier //
      .attach(shader_dir_path / "bezier.vert", GL_VERTEX_SHADER)
      .attach(shader_dir_path / "bezier.tcs.glsl", GL_TESS_CONTROL_SHADER)
      .attach(shader_dir_path / "bezier.tes.glsl", GL_TESS_EVALUATION_SHADER)
      .attach(shader_dir_path / "bezier.frag", GL_FRAGMENT_SHADER)
      .link();
  shader_overlay //
      .attach(shader_dir_path / "overlay.vert", GL_VERTEX_SHADER)
      .attach(shader_dir_path / "overlay.frag", GL_FRAGMENT_SHADER)
      .link();

  // bezier shader
  glPatchParameteri(GL_PATCH_VERTICES, 4);
  glUseProgram(shader_bezier.id());
  glGenVertexArrays(1, &ws.VAO_bezier);
  glBindVertexArray(ws.VAO_bezier);

  // Vertex positions
  glGenBuffers(1, &ws.VBO_pos);

  glBindBuffer(GL_ARRAY_BUFFER, ws.VBO_pos);
  glBufferData(GL_ARRAY_BUFFER, sizeof(V2f) * ws.point_pos.size(),
               ws.point_pos.data(), GL_DYNAMIC_DRAW);
  glEnableVertexAttribArray(0);
  glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, nullptr);

  // overlay shader
  glUseProgram(shader_overlay.id());
  glGenVertexArrays(1, &ws.VAO_overlay);
  glBindVertexArray(ws.VAO_overlay);
  glBindBuffer(GL_ARRAY_BUFFER, ws.VBO_pos);
  glEnableVertexAttribArray(0);
  glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, nullptr);
  glGenBuffers(1, &ws.VBO_color);
  glBindBuffer(GL_ARRAY_BUFFER, ws.VBO_color);
  glBufferData(GL_ARRAY_BUFFER, sizeof(V3f) * ws.point_color.size(),
               ws.point_color.data(), GL_STATIC_DRAW);
  glEnableVertexAttribArray(1);
  glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, 0, nullptr);

  glLineWidth(gl_line_width);
  glPointSize(gl_point_size);
  glClearColor(gray, gray, gray, 1.0f);

  std::cout << "Before render-loop: GLerror = " << glGetError() << std::endl;

  auto last_frame = std::chrono::high_resolution_clock::now();
  auto current_frame = std::chrono::high_resolution_clock::now();
  auto delta_time = current_frame - last_frame;
  constexpr float OPTIMAL_TIME = 1e9 / TARGET_FPS;

  do { /* Main render loop */
    glClear(GL_COLOR_BUFFER_BIT);
    glUseProgram(shader_bezier.id());
    glBindVertexArray(ws.VAO_bezier);
    glDrawArrays(GL_PATCHES, 0, 4);

    glUseProgram(shader_overlay.id());
    glBindVertexArray(ws.VAO_overlay);
    glDrawArrays(GL_POINTS, 0, 4);

    glfwSwapBuffers(window);
    glfwPollEvents();

    current_frame = std::chrono::high_resolution_clock::now();
    delta_time = current_frame - last_frame;
    last_frame = current_frame;

    std::this_thread::sleep_for(std::chrono::duration<float, std::nano>(
        std::max(0.0, OPTIMAL_TIME - delta_time.count() * 1e-9)));
  } while (!glfwWindowShouldClose(window));

  /* CLEAN-UP */
  glDeleteVertexArrays(1, &ws.VAO_bezier);
  glDeleteVertexArrays(1, &ws.VAO_overlay);
  glDeleteBuffers(1, &ws.VBO_pos);
  glDeleteBuffers(1, &ws.VBO_color);
  shader_bezier.destroy();
  glfwDestroyWindow(window);
  glfwTerminate();

  std::cout << "After cleanup: GLerror = " << glGetError() << std::endl;
}